

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void __thiscall hgdb::json::SymbolTable::compress_var(SymbolTable *this)

{
  pointer puVar1;
  reference pvVar2;
  __node_base _Var3;
  unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *m;
  pointer puVar4;
  size_type id;
  VariableCount v_count;
  unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
  ids;
  VarAssign var_assign;
  ulong local_38;
  
  v_count.count._M_h._M_buckets = &v_count.count._M_h._M_single_bucket;
  v_count.super_ScopeVisitor._vptr_ScopeVisitor = (_func_int **)&PTR_handle_0046f170;
  v_count.count._M_h._M_bucket_count = 1;
  v_count.count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  v_count.count._M_h._M_element_count = 0;
  v_count.count._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  v_count.count._M_h._M_rehash_policy._M_next_resize = 0;
  v_count.count._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->modules_).
                super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    ScopeVisitor::visit(&v_count.super_ScopeVisitor,
                        (ScopeBase *)
                        (puVar4->_M_t).
                        super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>
                        .super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl);
  }
  std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>::reserve
            (&this->variables_,v_count.count._M_h._M_element_count);
  ids._M_h._M_buckets = &ids._M_h._M_single_bucket;
  ids._M_h._M_bucket_count = 1;
  ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ids._M_h._M_element_count = 0;
  ids._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ids._M_h._M_rehash_policy._M_next_resize = 0;
  ids._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (_Var3 = v_count.count._M_h._M_before_begin; _Var3._M_nxt != (_Hash_node_base *)0x0;
      _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt) {
    std::pair<const_hgdb::json::Variable,_unsigned_long>::pair
              ((pair<const_hgdb::json::Variable,_unsigned_long> *)&var_assign,
               (pair<const_hgdb::json::Variable,_unsigned_long> *)(_Var3._M_nxt + 1));
    if (1 < local_38) {
      id = ((long)(this->variables_).
                  super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->variables_).
                 super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x58;
      pvVar2 = std::vector<hgdb::json::Variable,std::allocator<hgdb::json::Variable>>::
               emplace_back<hgdb::json::Variable_const&>
                         ((vector<hgdb::json::Variable,std::allocator<hgdb::json::Variable>> *)
                          &this->variables_,(Variable *)&var_assign);
      (pvVar2->id).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = id;
      (pvVar2->id).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = true;
      std::
      _Hashtable<hgdb::json::Variable,std::pair<hgdb::json::Variable_const,unsigned_long>,std::allocator<std::pair<hgdb::json::Variable_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<hgdb::json::Variable>,hgdb::json::Variable::hash_fn,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<hgdb::json::Variable&,unsigned_long&>
                ((_Hashtable<hgdb::json::Variable,std::pair<hgdb::json::Variable_const,unsigned_long>,std::allocator<std::pair<hgdb::json::Variable_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<hgdb::json::Variable>,hgdb::json::Variable::hash_fn,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&ids,pvVar2,&id);
    }
    Variable::~Variable((Variable *)&var_assign);
  }
  var_assign.super_ScopeVisitor._vptr_ScopeVisitor = (_func_int **)&PTR_handle_0046f1c0;
  puVar1 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  var_assign.id_ = &ids;
  for (puVar4 = (this->modules_).
                super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    ScopeVisitor::visit(&var_assign.super_ScopeVisitor,
                        (ScopeBase *)
                        (puVar4->_M_t).
                        super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>
                        .super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl);
  }
  std::
  _Hashtable<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&ids._M_h);
  VariableCount::~VariableCount(&v_count);
  return;
}

Assistant:

void compress_var() {
        // first pass collect all the variables
        VariableCount v_count;
        for (auto &m : modules_) {
            v_count.visit(m.get());
        }
        // compute the global variable pull
        variables_.reserve(v_count.count.size());
        std::unordered_map<Variable, uint64_t, Variable::hash_fn> ids;
        for (auto [var, c] : v_count.count) {
            if (c > 1) {
                auto id = variables_.size();
                auto &var_id = variables_.emplace_back(var);
                var_id.id = id;
                ids.emplace(var_id, id);
            }
        }

        // second pass to assign
        VarAssign var_assign(ids);
        for (auto &m : modules_) {
            var_assign.visit(m.get());
        }
    }